

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestProgram::SRGBTestProgram
          (SRGBTestProgram *this,Context *context,FragmentShaderParameters *shaderParameters)

{
  code *pcVar1;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  undefined4 uVar2;
  GLint GVar3;
  bool bVar4;
  int iVar5;
  GLuint GVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestContext *this_00;
  ShaderProgram *pSVar9;
  TestError *this_01;
  size_type __n;
  reference pvVar10;
  reference __s;
  size_t sVar11;
  ProgramInfo *pPVar12;
  ShaderInfo *pSVar13;
  ShaderProgram *in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  undefined1 local_268 [8];
  ShaderInfo shaderInfo;
  int shaderIdx;
  undefined1 local_1e8 [8];
  UniformData uniformData;
  int idx;
  vector<char,_std::allocator<char>_> uniformName;
  GLenum type;
  GLint location;
  GLint size;
  GLint maxLen;
  GLint activeUniforms;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_b0;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_a0;
  undefined4 local_8c;
  undefined1 local_88 [4];
  int totalShaderStages;
  ShaderProgramInfo buildInfo;
  TestLog *log;
  Functions *gl;
  FragmentShaderParameters *shaderParameters_local;
  Context *context_local;
  SRGBTestProgram *this_local;
  long lVar8;
  
  this->m_context = context;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            (&this->m_program);
  FragmentShaderParameters::FragmentShaderParameters
            (&this->m_shaderFragmentParameters,shaderParameters);
  std::__cxx11::string::string((string *)&this->m_shaderVertex);
  std::__cxx11::string::string((string *)&this->m_shaderFragment);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
  ::vector(&this->m_uniformDataList);
  this->m_blendRequired = false;
  this->m_toggleRequired = false;
  pRVar7 = gles31::Context::getRenderContext(this->m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  this_00 = gles31::Context::getTestContext(this->m_context);
  buildInfo.shaders.super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tcu::TestContext::getLog(this_00);
  glu::ShaderProgramInfo::ShaderProgramInfo((ShaderProgramInfo *)local_88);
  local_8c = 2;
  std::__cxx11::string::operator=
            ((string *)&this->m_shaderVertex,
             "#version 310 es \nlayout (location = 0) in mediump vec3 aPosition; \nlayout (location = 1) in mediump vec2 aTexCoord; \nout mediump vec2 vs_aTexCoord; \nvoid main () \n{ \n\tgl_Position = vec4(aPosition, 1.0); \n\tvs_aTexCoord = aTexCoord; \n} \n"
            );
  genFragmentShader(this);
  pSVar9 = (ShaderProgram *)operator_new(0xd0);
  maxLen._3_1_ = 1;
  pRVar7 = gles31::Context::getRenderContext(this->m_context);
  glu::makeVtxFragSources
            ((ProgramSources *)&activeUniforms,&this->m_shaderVertex,&this->m_shaderFragment);
  glu::ShaderProgram::ShaderProgram(pSVar9,pRVar7,(ProgramSources *)&activeUniforms);
  maxLen._3_1_ = 0;
  de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter
            ((DefaultDeleter<glu::ShaderProgram> *)((long)&maxLen + 2));
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_b0);
  local_a0 = de::details::MovePtr::operator_cast_to_PtrData(&local_b0,(MovePtr *)pSVar9);
  data._8_8_ = in_stack_fffffffffffffc80;
  data.ptr = in_stack_fffffffffffffc78;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
            (&this->m_program,data);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_b0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&activeUniforms);
  pSVar9 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator->(&(this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  bVar4 = glu::ShaderProgram::isOk(pSVar9);
  if (!bVar4) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Failed to compile shaders and link program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
               ,0x292);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(lVar8 + 0x9d8);
  GVar6 = getHandle(this);
  (*pcVar1)(GVar6,0x8b87,&location);
  pcVar1 = *(code **)(lVar8 + 0x9d8);
  GVar6 = getHandle(this);
  (*pcVar1)(GVar6,0x8b86,&size);
  __n = (size_type)location;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&idx,__n,
             (allocator_type *)&uniformData.field_0x2f);
  std::allocator<char>::~allocator((allocator<char> *)&uniformData.field_0x2f);
  uniformData.toggleDecode = false;
  uniformData._41_3_ = 0;
  for (; (int)uniformData._40_4_ < size; uniformData._40_4_ = uniformData._40_4_ + 1) {
    pcVar1 = *(code **)(lVar8 + 0x750);
    GVar6 = getHandle(this);
    GVar3 = location;
    uVar2 = uniformData._40_4_;
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)&idx,0);
    (*pcVar1)(GVar6,uVar2,GVar3,0,&type,
              &uniformName.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
              pvVar10);
    pcVar1 = *(code **)(lVar8 + 0xb48);
    GVar6 = getHandle(this);
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)&idx,0);
    GVar6 = (*pcVar1)(GVar6,pvVar10);
    uniformName.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = GVar6;
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)&idx,0);
    __s = std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)&idx,0);
    sVar11 = strlen(__s);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&shaderIdx,pvVar10,sVar11,
               (allocator *)((long)&shaderInfo.compileTimeUs + 7));
    UniformData::UniformData((UniformData *)local_1e8,GVar6,(string *)&shaderIdx);
    std::__cxx11::string::~string((string *)&shaderIdx);
    std::allocator<char>::~allocator((allocator<char> *)((long)&shaderInfo.compileTimeUs + 7));
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
    ::push_back(&this->m_uniformDataList,(value_type *)local_1e8);
    UniformData::~UniformData((UniformData *)local_1e8);
  }
  pSVar9 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator->(&(this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  pPVar12 = glu::ShaderProgram::getProgramInfo(pSVar9);
  glu::ProgramInfo::operator=((ProgramInfo *)local_88,pPVar12);
  for (shaderInfo.compileTimeUs._0_4_ = SHADERTYPE_VERTEX;
      (int)(ShaderType)shaderInfo.compileTimeUs < 2;
      shaderInfo.compileTimeUs._0_4_ = (ShaderType)shaderInfo.compileTimeUs + SHADERTYPE_FRAGMENT) {
    pSVar9 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
             operator->(&(this->m_program).
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       );
    pSVar13 = glu::ShaderProgram::getShaderInfo(pSVar9,(ShaderType)shaderInfo.compileTimeUs,0);
    glu::ShaderInfo::ShaderInfo((ShaderInfo *)local_268,pSVar13);
    std::vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>::push_back
              ((vector<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_> *)
               &buildInfo.program.linkTimeUs,(value_type *)local_268);
    glu::ShaderInfo::~ShaderInfo((ShaderInfo *)local_268);
  }
  glu::operator<<((TestLog *)
                  buildInfo.shaders.
                  super__Vector_base<glu::ShaderInfo,_std::allocator<glu::ShaderInfo>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ShaderProgramInfo *)local_88);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&idx);
  glu::ShaderProgramInfo::~ShaderProgramInfo((ShaderProgramInfo *)local_88);
  return;
}

Assistant:

SRGBTestProgram::SRGBTestProgram	(Context& context, const FragmentShaderParameters& shaderParameters)
	: m_context						(context)
	, m_shaderFragmentParameters	(shaderParameters)
	, m_blendRequired				(false)
	, m_toggleRequired				(false)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::TestLog&			log					= m_context.getTestContext().getLog();
	glu::ShaderProgramInfo	buildInfo;
	const int				totalShaderStages	= 2;

	// default vertex shader used in all tests
	m_shaderVertex =	"#version 310 es \n"
						"layout (location = 0) in mediump vec3 aPosition; \n"
						"layout (location = 1) in mediump vec2 aTexCoord; \n"
						"out mediump vec2 vs_aTexCoord; \n"
						"void main () \n"
						"{ \n"
						"	gl_Position = vec4(aPosition, 1.0); \n"
						"	vs_aTexCoord = aTexCoord; \n"
						"} \n";

	this->genFragmentShader();

	m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(m_shaderVertex, m_shaderFragment)));

	if (!m_program->isOk())
	{
		TCU_FAIL("Failed to compile shaders and link program");
	}

	glw::GLint activeUniforms, maxLen;
	glw::GLint size, location;
	glw::GLenum type;

	gl.getProgramiv(this->getHandle(), GL_ACTIVE_UNIFORM_MAX_LENGTH, &maxLen);
	gl.getProgramiv(this->getHandle(), GL_ACTIVE_UNIFORMS, &activeUniforms);

	std::vector<glw::GLchar> uniformName(static_cast<int>(maxLen));
	for (int idx = 0; idx < activeUniforms; idx++)
	{
		gl.getActiveUniform(this->getHandle(), idx, maxLen, NULL, &size, &type, &uniformName[0]);
		location = gl.getUniformLocation(this->getHandle(), &uniformName[0]);

		UniformData uniformData(location, std::string(&uniformName[0], strlen(&uniformName[0])));
		m_uniformDataList.push_back(uniformData);
	}

	// log shader program info. Only vertex and fragment shaders included
	buildInfo.program = m_program->getProgramInfo();
	for (int shaderIdx = 0; shaderIdx < totalShaderStages; shaderIdx++)
	{
		glu::ShaderInfo shaderInfo = m_program->getShaderInfo(static_cast<glu::ShaderType>(static_cast<int>(glu::SHADERTYPE_VERTEX) + static_cast<int>(shaderIdx)), 0);
		buildInfo.shaders.push_back(shaderInfo);
	}

	log << buildInfo;
}